

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLSSetLinSysFn(void *arkode_mem,ARKLsLinSysFn linsys)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKodeMem local_20;
  ARKLsMem local_18;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSSetJacFn",&local_20,&local_18);
  if (iVar1 == 0) {
    if (linsys == (ARKLsLinSysFn)0x0) {
      local_18->user_linsys = 0;
      local_18->linsys = arkLsLinSys;
    }
    else {
      if (local_18->A == (SUNMatrix)0x0) {
        arkProcessError(local_20,-3,"ARKLS","arkLSSetLinSysFn",
                        "Linear system setup routine cannot be supplied for NULL SUNMatrix");
        return -3;
      }
      local_18->user_linsys = 1;
      local_18->linsys = linsys;
      local_20 = (ARKodeMem)local_20->user_data;
    }
    local_18->A_data = local_20;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSSetLinSysFn(void *arkode_mem, ARKLsLinSysFn linsys)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetJacFn",
                            &ark_mem, &arkls_mem);
  if (retval != ARKLS_SUCCESS) return(retval);

  /* return with failure if linsys cannot be used */
  if ((linsys != NULL) && (arkls_mem->A == NULL)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetLinSysFn",
                   "Linear system setup routine cannot be supplied for NULL SUNMatrix");
    return(ARKLS_ILL_INPUT);
  }

  /* set the linear system routine pointer, and update relevant flags */
  if (linsys != NULL) {
    arkls_mem->user_linsys = SUNTRUE;
    arkls_mem->linsys      = linsys;
    arkls_mem->A_data      = ark_mem->user_data;
  } else {
    arkls_mem->user_linsys = SUNFALSE;
    arkls_mem->linsys      = arkLsLinSys;
    arkls_mem->A_data      = ark_mem;
  }

  return(ARKLS_SUCCESS);
}